

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O2

void leopard::ff16::IFFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint64_t uVar23;
  long lVar24;
  long lVar25;
  ushort uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  
  if (CpuHasAVX2 == '\x01') {
    auVar40[8] = 0xf;
    auVar40._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar40[9] = 0xf;
    auVar40[10] = 0xf;
    auVar40[0xb] = 0xf;
    auVar40[0xc] = 0xf;
    auVar40[0xd] = 0xf;
    auVar40[0xe] = 0xf;
    auVar40[0xf] = 0xf;
    auVar40[0x10] = 0xf;
    auVar40[0x11] = 0xf;
    auVar40[0x12] = 0xf;
    auVar40[0x13] = 0xf;
    auVar40[0x14] = 0xf;
    auVar40[0x15] = 0xf;
    auVar40[0x16] = 0xf;
    auVar40[0x17] = 0xf;
    auVar40[0x18] = 0xf;
    auVar40[0x19] = 0xf;
    auVar40[0x1a] = 0xf;
    auVar40[0x1b] = 0xf;
    auVar40[0x1c] = 0xf;
    auVar40[0x1d] = 0xf;
    auVar40[0x1e] = 0xf;
    auVar40[0x1f] = 0xf;
    lVar25 = (ulong)log_m * 0x100;
    auVar10 = *(undefined1 (*) [32])(Multiply256LUT + lVar25);
    auVar11 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + lVar25);
    auVar12 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + lVar25);
    auVar13 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + lVar25);
    auVar14 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + lVar25);
    auVar15 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + lVar25);
    auVar16 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + lVar25);
    auVar17 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + lVar25);
    uVar23 = 0;
    do {
      auVar37 = *(undefined1 (*) [32])((long)x + uVar23);
      auVar38 = *(undefined1 (*) [32])((long)x + uVar23 + 0x20);
      auVar22 = auVar37 ^ *(undefined1 (*) [32])((long)y + uVar23);
      auVar35 = auVar38 ^ *(undefined1 (*) [32])((long)y + uVar23 + 0x20);
      auVar42 = vpsrlq_avx2(auVar22,4);
      *(undefined1 (*) [32])((long)y + uVar23) = auVar22;
      auVar22 = vpand_avx2(auVar22,auVar40);
      *(undefined1 (*) [32])((long)y + uVar23 + 0x20) = auVar35;
      auVar33 = vpsrlq_avx512vl(auVar35,4);
      auVar35 = vpand_avx2(auVar35,auVar40);
      auVar42 = vpand_avx2(auVar42,auVar40);
      auVar36 = vpshufb_avx2(auVar10,auVar22);
      auVar34 = vpshufb_avx512vl(auVar12,auVar35);
      auVar22 = vpshufb_avx2(auVar14,auVar22);
      auVar35 = vpshufb_avx2(auVar16,auVar35);
      auVar21 = vpshufb_avx2(auVar11,auVar42);
      auVar42 = vpshufb_avx2(auVar15,auVar42);
      auVar42 = vpternlogq_avx512vl(auVar35,auVar42,auVar22,0x96);
      auVar35 = vpandq_avx512vl(auVar33,auVar40);
      auVar36 = vpternlogq_avx512vl(auVar34,auVar21,auVar36,0x96);
      auVar22 = vpshufb_avx2(auVar13,auVar35);
      auVar35 = vpshufb_avx2(auVar17,auVar35);
      auVar37 = vpternlogq_avx512vl(auVar22,auVar37,auVar36,0x96);
      auVar38 = vpternlogq_avx512vl(auVar35,auVar38,auVar42,0x96);
      *(undefined1 (*) [32])((long)x + uVar23) = auVar37;
      *(undefined1 (*) [32])((long)x + uVar23 + 0x20) = auVar38;
      uVar23 = uVar23 + 0x40;
    } while (bytes != uVar23);
  }
  else if (CpuHasSSSE3 == '\x01') {
    auVar39[8] = 0xf;
    auVar39._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar39[9] = 0xf;
    auVar39[10] = 0xf;
    auVar39[0xb] = 0xf;
    auVar39[0xc] = 0xf;
    auVar39[0xd] = 0xf;
    auVar39[0xe] = 0xf;
    auVar39[0xf] = 0xf;
    lVar25 = (ulong)log_m * 0x80;
    auVar2 = *(undefined1 (*) [16])(Multiply128LUT + lVar25);
    auVar3 = *(undefined1 (*) [16])(Multiply128LUT + 0x10 + lVar25);
    auVar4 = *(undefined1 (*) [16])(Multiply128LUT + 0x20 + lVar25);
    auVar5 = *(undefined1 (*) [16])(Multiply128LUT + 0x30 + lVar25);
    auVar6 = *(undefined1 (*) [16])(Multiply128LUT + 0x40 + lVar25);
    auVar7 = *(undefined1 (*) [16])(Multiply128LUT + 0x50 + lVar25);
    auVar8 = *(undefined1 (*) [16])(Multiply128LUT + 0x60 + lVar25);
    auVar9 = *(undefined1 (*) [16])(Multiply128LUT + 0x70 + lVar25);
    uVar23 = 0;
    do {
      auVar31 = *(undefined1 (*) [16])((long)x + uVar23 + 0x10);
      auVar32 = *(undefined1 (*) [16])((long)x + uVar23 + 0x30);
      auVar20 = auVar31 ^ *(undefined1 (*) [16])((long)y + uVar23 + 0x10);
      auVar29 = auVar32 ^ *(undefined1 (*) [16])((long)y + uVar23 + 0x30);
      auVar41 = vpsrlq_avx(auVar20,4);
      *(undefined1 (*) [16])((long)y + uVar23 + 0x10) = auVar20;
      auVar20 = vpand_avx(auVar20,auVar39);
      *(undefined1 (*) [16])((long)y + uVar23 + 0x30) = auVar29;
      auVar27 = vpsrlq_avx512vl(auVar29,4);
      auVar29 = vpand_avx(auVar29,auVar39);
      auVar41 = vpand_avx(auVar41,auVar39);
      auVar30 = vpshufb_avx(auVar2,auVar20);
      auVar28 = vpshufb_avx512vl(auVar4,auVar29);
      auVar20 = vpshufb_avx(auVar6,auVar20);
      auVar29 = vpshufb_avx(auVar8,auVar29);
      auVar19 = vpshufb_avx(auVar3,auVar41);
      auVar41 = vpshufb_avx(auVar7,auVar41);
      auVar41 = vpternlogq_avx512vl(auVar29,auVar41,auVar20,0x96);
      auVar29 = vpandq_avx512vl(auVar27,auVar39);
      auVar30 = vpternlogq_avx512vl(auVar28,auVar19,auVar30,0x96);
      auVar20 = vpshufb_avx(auVar5,auVar29);
      auVar29 = vpshufb_avx(auVar9,auVar29);
      auVar31 = vpternlogq_avx512vl(auVar20,auVar31,auVar30,0x96);
      auVar32 = vpternlogq_avx512vl(auVar29,auVar32,auVar41,0x96);
      *(undefined1 (*) [16])((long)x + uVar23 + 0x10) = auVar31;
      *(undefined1 (*) [16])((long)x + uVar23 + 0x30) = auVar32;
      auVar31 = *(undefined1 (*) [16])((long)x + uVar23);
      auVar32 = *(undefined1 (*) [16])((long)x + uVar23 + 0x20);
      auVar20 = auVar31 ^ *(undefined1 (*) [16])((long)y + uVar23);
      auVar29 = auVar32 ^ *(undefined1 (*) [16])((long)y + uVar23 + 0x20);
      auVar41 = vpsrlq_avx(auVar20,4);
      *(undefined1 (*) [16])((long)y + uVar23) = auVar20;
      auVar20 = vpand_avx(auVar20,auVar39);
      *(undefined1 (*) [16])((long)y + uVar23 + 0x20) = auVar29;
      auVar27 = vpsrlq_avx512vl(auVar29,4);
      auVar29 = vpand_avx(auVar29,auVar39);
      auVar41 = vpand_avx(auVar41,auVar39);
      auVar30 = vpshufb_avx(auVar2,auVar20);
      auVar28 = vpshufb_avx512vl(auVar4,auVar29);
      auVar20 = vpshufb_avx(auVar6,auVar20);
      auVar29 = vpshufb_avx(auVar8,auVar29);
      auVar19 = vpshufb_avx(auVar3,auVar41);
      auVar41 = vpshufb_avx(auVar7,auVar41);
      auVar41 = vpternlogq_avx512vl(auVar29,auVar41,auVar20,0x96);
      auVar29 = vpandq_avx512vl(auVar27,auVar39);
      auVar30 = vpternlogq_avx512vl(auVar28,auVar19,auVar30,0x96);
      auVar20 = vpshufb_avx(auVar5,auVar29);
      auVar29 = vpshufb_avx(auVar9,auVar29);
      auVar31 = vpternlogq_avx512vl(auVar20,auVar31,auVar30,0x96);
      auVar32 = vpternlogq_avx512vl(auVar29,auVar32,auVar41,0x96);
      *(undefined1 (*) [16])((long)x + uVar23) = auVar31;
      *(undefined1 (*) [16])((long)x + uVar23 + 0x20) = auVar32;
      uVar23 = uVar23 + 0x40;
    } while (bytes != uVar23);
  }
  else {
    xor_mem(y,x,bytes);
    lVar24 = (ulong)log_m * 0x80 + Multiply16LUT;
    lVar25 = 0x20;
    do {
      for (; lVar25 != 0x40; lVar25 = lVar25 + 1) {
        bVar18 = *(byte *)((long)y + lVar25 + -0x20);
        uVar26 = *(ushort *)(lVar24 + 0x20 + (ulong)(bVar18 >> 4) * 2) ^
                 *(ushort *)(lVar24 + (ulong)(bVar18 & 0xf) * 2) ^
                 *(ushort *)(lVar24 + 0x40 + (ulong)(*(byte *)((long)y + lVar25) & 0xf) * 2) ^
                 *(ushort *)(lVar24 + 0x60 + (ulong)(*(byte *)((long)y + lVar25) >> 4) * 2);
        pbVar1 = (byte *)((long)x + lVar25 + -0x20);
        *pbVar1 = *pbVar1 ^ (byte)uVar26;
        *(byte *)((long)x + lVar25) = *(byte *)((long)x + lVar25) ^ (byte)(uVar26 >> 8);
      }
      x = (void *)((long)x + 0x40);
      y = (void *)((long)y + 0x40);
      bytes = bytes - 0x40;
      lVar25 = 0x20;
    } while (bytes != 0);
  }
  return;
}

Assistant:

static void IFFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_IFFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); }

            LEO_IFFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_IFFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); }

            LEO_IFFTB_128(x16 + 1, y16 + 1);
            LEO_IFFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    xor_mem(y, x, bytes);
    RefMulAdd(x, y, log_m, bytes);
}